

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O2

void __thiscall OB::Parg::argvf(Parg *this,char **_argv)

{
  int iVar1;
  long lVar2;
  char **__args;
  
  iVar1 = this->argc_;
  if (0 < iVar1) {
    __args = _argv + 1;
    for (lVar2 = 1; lVar2 < iVar1; lVar2 = lVar2 + 1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->argv_,
                 __args);
      iVar1 = this->argc_;
      __args = __args + 1;
    }
    this->argc_ = iVar1 + -1;
  }
  return;
}

Assistant:

void argvf(char** _argv)
  {
    // std::cout << "argc: " << argc_ << std::endl;
    // removes first arg
    if (argc_ < 1) return;
    for (int i = 1; i < argc_; ++i)
    {
      argv_.emplace_back(_argv[i]);
      // std::cout << "argv: " << i << " -> " << argv_.at(i) << std::endl;
    }
    --argc_;
  }